

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

void __thiscall
QtPrivate::QTypeNormalizer::normalizeIntegerTypes(QTypeNormalizer *this,char **begin,char *end)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_38 = 0;
  local_34 = 0;
  local_40 = 0;
  if (*begin < end) {
    iVar7 = 0;
    local_3c = 0;
    local_40 = 0;
    local_34 = 0;
    local_38 = 0;
    iVar6 = 0;
    do {
      while (bVar2 = skipToken(begin,end,"long",false), bVar2) {
        iVar6 = iVar6 + 1;
        if (end <= *begin) goto LAB_00285de7;
      }
      bVar2 = skipToken(begin,end,"int",false);
      if (bVar2) {
        local_40 = local_40 + 1;
      }
      else {
        bVar2 = skipToken(begin,end,"short",false);
        if (bVar2) {
          local_3c = local_3c + 1;
        }
        else {
          bVar2 = skipToken(begin,end,"unsigned",false);
          if (bVar2) {
            local_34 = local_34 + 1;
          }
          else {
            bVar2 = skipToken(begin,end,"signed",false);
            if (bVar2) {
              local_38 = local_38 + 1;
            }
            else {
              bVar2 = skipToken(begin,end,"char",false);
              if (!bVar2) break;
              iVar7 = iVar7 + 1;
            }
          }
        }
      }
    } while (*begin < end);
LAB_00285de7:
    iVar3 = iVar6;
    if (iVar6 == 2) {
      this->last = 'q';
      this->len = this->len + 1;
      pcVar1 = this->output;
      iVar3 = 2;
      if (pcVar1 != (char *)0x0) {
        this->output = pcVar1 + 1;
        *pcVar1 = 'q';
      }
    }
    if ((local_38 == 0) || (iVar7 == 0)) {
      if (local_34 == 0) {
        local_34 = 0;
      }
      else {
        this->last = 'u';
        this->len = this->len + 1;
        pcVar1 = this->output;
        if (pcVar1 != (char *)0x0) {
          this->output = pcVar1 + 1;
          *pcVar1 = 'u';
        }
      }
    }
    else {
      cVar5 = 's';
      lVar4 = 1;
      do {
        this->last = cVar5;
        this->len = this->len + 1;
        pcVar1 = this->output;
        if (pcVar1 != (char *)0x0) {
          this->output = pcVar1 + 1;
          *pcVar1 = cVar5;
        }
        cVar5 = "signed "[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
    }
    if (iVar7 != 0) {
      cVar5 = 'c';
      lVar4 = 0;
      do {
        this->last = cVar5;
        this->len = this->len + 1;
        pcVar1 = this->output;
        if (pcVar1 != (char *)0x0) {
          this->output = pcVar1 + 1;
          *pcVar1 = cVar5;
        }
        cVar5 = "unsigned char"[lVar4 + 10];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      return;
    }
    if (local_3c != 0) {
      cVar5 = 's';
      lVar4 = 1;
      do {
        this->last = cVar5;
        this->len = this->len + 1;
        pcVar1 = this->output;
        if (pcVar1 != (char *)0x0) {
          this->output = pcVar1 + 1;
          *pcVar1 = cVar5;
        }
        cVar5 = "unsigned short"[lVar4 + 9];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 6);
      return;
    }
    if (iVar3 == 1) {
      cVar5 = 'l';
      lVar4 = 0;
      do {
        this->last = cVar5;
        this->len = this->len + 1;
        pcVar1 = this->output;
        if (pcVar1 != (char *)0x0) {
          this->output = pcVar1 + 1;
          *pcVar1 = cVar5;
        }
        cVar5 = "unsigned long"[lVar4 + 10];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      return;
    }
    if (iVar6 == 2) {
      cVar5 = 'l';
      lVar4 = 0;
      do {
        this->last = cVar5;
        this->len = this->len + 1;
        pcVar1 = this->output;
        if (pcVar1 != (char *)0x0) {
          this->output = pcVar1 + 1;
          *pcVar1 = cVar5;
        }
        cVar5 = "qlonglong"[lVar4 + 2];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      return;
    }
  }
  if ((local_38 != 0 || local_34 != 0) || local_40 != 0) {
    cVar5 = 'i';
    lVar4 = 1;
    do {
      this->last = cVar5;
      this->len = this->len + 1;
      pcVar1 = this->output;
      if (pcVar1 != (char *)0x0) {
        this->output = pcVar1 + 1;
        *pcVar1 = cVar5;
      }
      cVar5 = "unsigned int"[lVar4 + 9];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  return;
}

Assistant:

constexpr void normalizeIntegerTypes(const char *&begin, const char *end)
    {
        int numLong = 0;
        int numSigned = 0;
        int numUnsigned = 0;
        int numInt = 0;
        int numShort = 0;
        int numChar = 0;
        while (begin < end) {
            if (skipToken(begin, end, "long")) {
                numLong++;
                continue;
            }
            if (skipToken(begin, end, "int")) {
                numInt++;
                continue;
            }
            if (skipToken(begin, end, "short")) {
                numShort++;
                continue;
            }
            if (skipToken(begin, end, "unsigned")) {
                numUnsigned++;
                continue;
            }
            if (skipToken(begin, end, "signed")) {
                numSigned++;
                continue;
            }
            if (skipToken(begin, end, "char")) {
                numChar++;
                continue;
            }
#ifdef Q_CC_MSVC
            if (skipToken(begin, end, "__int64")) {
                numLong = 2;
                continue;
            }
#endif
            break;
        }
        if (numLong == 2)
            append('q'); // q(u)longlong
        if (numSigned && numChar)
            appendStr("signed ");
        else if (numUnsigned)
            appendStr("u");
        if (numChar)
            appendStr("char");
        else if (numShort)
            appendStr("short");
        else if (numLong == 1)
            appendStr("long");
        else if (numLong == 2)
            appendStr("longlong");
        else if (numUnsigned || numSigned || numInt)
            appendStr("int");
    }